

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O0

string * ToBinaryPayload_abi_cxx11_(string *__return_storage_ptr__,UnknownFields *fields)

{
  bool bVar1;
  byte *pbVar2;
  uint64_t val_00;
  string local_b0;
  UnknownFields *local_90;
  Group *val_5;
  add_pointer_t<const_Fixed32> ptStack_80;
  uint32_t swapped_1;
  Fixed32 *val_4;
  uint64_t swapped;
  Fixed64 *val_3;
  Delimited *val_2;
  LongVarint *val_1;
  add_pointer_t<const_Varint> local_48;
  Varint *val;
  UnknownField *field;
  const_iterator __end1;
  const_iterator __begin1;
  UnknownFields *__range1;
  UnknownFields *fields_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<UnknownField,_std::allocator<UnknownField>_>::begin(fields);
  field = (UnknownField *)std::vector<UnknownField,_std::allocator<UnknownField>_>::end(fields);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_UnknownField_*,_std::vector<UnknownField,_std::allocator<UnknownField>_>_>
                                     *)&field), bVar1) {
    val = (Varint *)
          __gnu_cxx::
          __normal_iterator<const_UnknownField_*,_std::vector<UnknownField,_std::allocator<UnknownField>_>_>
          ::operator*(&__end1);
    local_48 = std::get_if<Varint,Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>
                         (&((reference)val)->value);
    if (local_48 == (add_pointer_t<const_Varint>)0x0) {
      val_2 = (Delimited *)
              std::get_if<LongVarint,Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>
                        ((variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group> *)
                         (val + 1));
      if (val_2 == (Delimited *)0x0) {
        val_3 = (Fixed64 *)
                std::get_if<Delimited,Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>
                          ((variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group> *)
                           (val + 1));
        if ((add_pointer_t<const_Delimited>)val_3 == (add_pointer_t<const_Delimited>)0x0) {
          swapped = (uint64_t)
                    std::get_if<Fixed64,Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>
                              ((variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group> *)
                               (val + 1));
          if ((add_pointer_t<const_Fixed64>)swapped == (add_pointer_t<const_Fixed64>)0x0) {
            ptStack_80 = std::get_if<Fixed32,Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>
                                   ((variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                     *)(val + 1));
            if (ptStack_80 == (add_pointer_t<const_Fixed32>)0x0) {
              local_90 = &std::get_if<Group,Varint,LongVarint,Delimited,Fixed64,Fixed32,Group>
                                    ((variant<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                                      *)(val + 1))->val;
              if (local_90 != (UnknownFields *)0x0) {
                EncodeVarint((ulong)((int)val->val * 8 + 3),__return_storage_ptr__);
                ToBinaryPayload_abi_cxx11_(&local_b0,local_90);
                std::__cxx11::string::append((string *)__return_storage_ptr__);
                std::__cxx11::string::~string((string *)&local_b0);
                EncodeVarint((ulong)((int)val->val * 8 + 4),__return_storage_ptr__);
              }
            }
            else {
              EncodeVarint((ulong)((int)val->val * 8 + 5),__return_storage_ptr__);
              val_5._4_4_ = upb_BigEndian32(ptStack_80->val);
              std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&val_5 + 4);
            }
          }
          else {
            EncodeVarint((ulong)((int)val->val * 8 + 1),__return_storage_ptr__);
            val_4 = (Fixed32 *)upb_BigEndian64(*(uint64_t *)swapped);
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&val_4);
          }
        }
        else {
          EncodeVarint((ulong)((int)val->val * 8 + 2),__return_storage_ptr__);
          val_00 = std::__cxx11::string::size();
          EncodeVarint(val_00,__return_storage_ptr__);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      else {
        EncodeVarint((ulong)(uint)((int)val->val << 3),__return_storage_ptr__);
        EncodeVarint(*(uint64_t *)&val_2->val,__return_storage_ptr__);
        pbVar2 = (byte *)std::__cxx11::string::back();
        *pbVar2 = *pbVar2 | 0x80;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
    else {
      EncodeVarint((ulong)(uint)((int)val->val << 3),__return_storage_ptr__);
      EncodeVarint(local_48->val,__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_UnknownField_*,_std::vector<UnknownField,_std::allocator<UnknownField>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToBinaryPayload(const UnknownFields& fields) {
  std::string ret;

  for (const auto& field : fields) {
    if (const auto* val = std::get_if<Varint>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Varint, &ret);
      EncodeVarint(val->val, &ret);
    } else if (const auto* val = std::get_if<LongVarint>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Varint, &ret);
      EncodeVarint(val->val, &ret);
      ret.back() |= 0x80;
      ret.push_back(0);
    } else if (const auto* val = std::get_if<Delimited>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_Delimited, &ret);
      EncodeVarint(val->val.size(), &ret);
      ret.append(val->val);
    } else if (const auto* val = std::get_if<Fixed64>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_64Bit, &ret);
      uint64_t swapped = upb_BigEndian64(val->val);
      ret.append(reinterpret_cast<const char*>(&swapped), sizeof(swapped));
    } else if (const auto* val = std::get_if<Fixed32>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_32Bit, &ret);
      uint32_t swapped = upb_BigEndian32(val->val);
      ret.append(reinterpret_cast<const char*>(&swapped), sizeof(swapped));
    } else if (const auto* val = std::get_if<Group>(&field.value)) {
      EncodeVarint(field.field_number << 3 | kUpb_WireType_StartGroup, &ret);
      ret.append(ToBinaryPayload(val->val));
      EncodeVarint(field.field_number << 3 | kUpb_WireType_EndGroup, &ret);
    }
  }

  return ret;
}